

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

int xfwd_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  _func_void_Plug_ptr_PlugCloseType_char_ptr *p_Var1;
  Plug *in_RAX;
  Channel *pfchan;
  Socket *s;
  char *pcVar2;
  SocketPeerInfo *pi;
  SshChannel *sc;
  Plug *plug;
  Plug *local_38;
  
  local_38 = in_RAX;
  pfchan = portfwd_raw_new((ConnectionLayer *)(p[-0xad].vt)->closing,&local_38,false);
  s = (*constructor)((accept_ctx_t)ctx.p,local_38);
  pcVar2 = (*s->vt->socket_error)(s);
  if (pcVar2 == (char *)0x0) {
    pi = (*s->vt->peer_info)(s);
    p_Var1 = (p[-0xad].vt)->closing;
    sc = (SshChannel *)(**(code **)(*(long *)(p_Var1 + 8) + 0x20))(p_Var1,pfchan,pi);
    portfwd_raw_setup(pfchan,s,sc);
    sk_free_peer_info(pi);
  }
  else {
    portfwd_raw_free(pfchan);
  }
  return (uint)(pcVar2 != (char *)0x0);
}

Assistant:

static int xfwd_accepting(Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    sesschan *sess = container_of(p, sesschan, xfwd_plug);
    Plug *plug;
    Channel *chan;
    Socket *s;
    SocketPeerInfo *pi;
    const char *err;

    chan = portfwd_raw_new(sess->c->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }
    pi = sk_peer_info(s);
    portfwd_raw_setup(chan, s, ssh_serverside_x11_open(sess->c->cl, chan, pi));
    sk_free_peer_info(pi);

    return 0;
}